

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlGlyphDefn.h
# Opt level: O0

undefined8 GdlGlyphDefn::GlyphIDString_abi_cxx11_(gid16 wGlyphID)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  undefined8 uVar4;
  ushort in_SI;
  undefined8 in_RDI;
  ostringstream strmStr;
  ostringstream local_188 [382];
  ushort local_a;
  
  local_a = in_SI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar3 = (ostream *)std::ostream::operator<<(local_188,local_a);
  poVar3 = std::operator<<(poVar3," [0x");
  uVar4 = std::ostream::operator<<(poVar3,std::hex);
  _Var1 = std::setfill<char>('0');
  poVar3 = std::operator<<(uVar4,_Var1._M_c);
  _Var2 = std::setw(4);
  poVar3 = std::operator<<(poVar3,_Var2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_a);
  std::operator<<(poVar3,']');
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

static std::string GlyphIDString(gid16 wGlyphID)
	{
		std::ostringstream strmStr;
		strmStr	<< wGlyphID 
				<< " [0x" 
				<< std::hex << std::setfill('0') << std::setw(4) 
				<< wGlyphID << ']';

		return strmStr.str();
	}